

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *sig,uchar *input64,
              int recid)

{
  uint in_ECX;
  long in_RDX;
  secp256k1_ecdsa_recoverable_signature *in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  int iVar1;
  uint uVar2;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_48;
  uint local_24;
  secp256k1_ecdsa_recoverable_signature *local_18;
  uint local_4;
  
  uVar2 = 1;
  iVar1 = 0;
  if (in_RSI == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x100000000,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x100000000,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    local_4 = 0;
  }
  else if (in_ECX < 4) {
    local_24 = in_ECX;
    local_18 = in_RSI;
    secp256k1_scalar_set_b32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int *)0x100000000)
    ;
    uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int *)CONCAT44(uVar2,iVar1));
    uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
    if (uVar2 == 0) {
      memset(local_18,0,0x41);
      local_4 = uVar2;
    }
    else {
      secp256k1_ecdsa_recoverable_signature_save
                (local_18,&local_48,(secp256k1_scalar *)&stack0xffffffffffffff98,local_24);
      local_4 = uVar2;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)0x100000000,
               (char *)CONCAT17(in_ECX < 4,in_stack_ffffffffffffff88));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature* sig, const unsigned char *input64, int recid) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);
    ARG_CHECK(recid >= 0 && recid <= 3);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_recoverable_signature_save(sig, &r, &s, recid);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}